

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mul-mat0.c
# Opt level: O3

ggml_tensor * get_random_tensor(ggml_context *ctx0,int ndims,int64_t *ne,float fmin,float fmax)

{
  undefined1 auVar1 [16];
  int iVar2;
  ggml_tensor *pgVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  pgVar3 = (ggml_tensor *)ggml_new_tensor(ctx0,0,ndims,ne);
  switch(ndims) {
  case 1:
    if (0 < *ne) {
      lVar9 = 0;
      do {
        iVar2 = rand();
        auVar1 = vfmadd213ss_fma(ZEXT416((uint)((float)iVar2 * 4.656613e-10)),
                                 ZEXT416((uint)(fmax - fmin)),ZEXT416((uint)fmin));
        *(int *)((long)pgVar3->data + lVar9 * 4) = auVar1._0_4_;
        lVar9 = lVar9 + 1;
      } while (lVar9 < *ne);
    }
    break;
  case 2:
    lVar9 = ne[1];
    if (0 < lVar9) {
      lVar4 = *ne;
      lVar6 = 0;
      lVar10 = 0;
      do {
        if (0 < lVar4) {
          lVar9 = 0;
          do {
            iVar2 = rand();
            lVar4 = *ne;
            auVar1 = vfmadd213ss_fma(ZEXT416((uint)((float)iVar2 * 4.656613e-10)),
                                     ZEXT416((uint)(fmax - fmin)),ZEXT416((uint)fmin));
            *(int *)((long)pgVar3->data + lVar9 * 4 + lVar6 * lVar4) = auVar1._0_4_;
            lVar9 = lVar9 + 1;
          } while (lVar9 < lVar4);
          lVar9 = ne[1];
        }
        lVar10 = lVar10 + 1;
        lVar6 = lVar6 + 4;
      } while (lVar10 < lVar9);
    }
    break;
  case 3:
    lVar9 = ne[2];
    if (0 < lVar9) {
      lVar4 = ne[1];
      lVar10 = 0;
      do {
        if (0 < lVar4) {
          lVar9 = *ne;
          lVar6 = 0;
          do {
            if (0 < lVar9) {
              lVar7 = 0;
              do {
                iVar2 = rand();
                lVar9 = *ne;
                lVar4 = ne[1];
                auVar1 = vfmadd213ss_fma(ZEXT416((uint)((float)iVar2 * 4.656613e-10)),
                                         ZEXT416((uint)(fmax - fmin)),ZEXT416((uint)fmin));
                *(int *)((long)pgVar3->data + lVar7 * 4 + (lVar10 * lVar4 + lVar6) * lVar9 * 4) =
                     auVar1._0_4_;
                lVar7 = lVar7 + 1;
              } while (lVar7 < lVar9);
            }
            lVar6 = lVar6 + 1;
          } while (lVar6 < lVar4);
          lVar9 = ne[2];
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < lVar9);
    }
    break;
  case 4:
    lVar9 = ne[3];
    if (0 < lVar9) {
      lVar4 = ne[2];
      lVar10 = 0;
      do {
        if (0 < lVar4) {
          lVar9 = ne[1];
          lVar6 = 0;
          do {
            if (0 < lVar9) {
              lVar7 = *ne;
              lVar8 = 0;
              do {
                if (0 < lVar7) {
                  lVar5 = 0;
                  do {
                    iVar2 = rand();
                    lVar4 = ne[2];
                    lVar7 = *ne;
                    lVar9 = ne[1];
                    auVar1 = vfmadd213ss_fma(ZEXT416((uint)((float)iVar2 * 4.656613e-10)),
                                             ZEXT416((uint)(fmax - fmin)),ZEXT416((uint)fmin));
                    *(int *)((long)pgVar3->data +
                            lVar5 * 4 + ((lVar10 * lVar4 + lVar6) * lVar9 + lVar8) * lVar7 * 4) =
                         auVar1._0_4_;
                    lVar5 = lVar5 + 1;
                  } while (lVar5 < lVar7);
                }
                lVar8 = lVar8 + 1;
              } while (lVar8 < lVar9);
            }
            lVar6 = lVar6 + 1;
          } while (lVar6 < lVar4);
          lVar9 = ne[3];
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < lVar9);
    }
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat0.c"
                  ,0x4b,
                  "struct ggml_tensor *get_random_tensor(struct ggml_context *, int, int64_t *, float, float)"
                 );
  }
  return pgVar3;
}

Assistant:

struct ggml_tensor * get_random_tensor(
        struct ggml_context * ctx0,
        int ndims,
        int64_t ne[],
        float fmin,
        float fmax) {
    struct ggml_tensor * result = ggml_new_tensor(ctx0, GGML_TYPE_F32, ndims, ne);

    switch (ndims) {
        case 1:
            for (int i0 = 0; i0 < ne[0]; i0++) {
                ((float *)result->data)[i0] = frand()*(fmax - fmin) + fmin;
            }
            break;
        case 2:
            for (int i1 = 0; i1 < ne[1]; i1++) {
                for (int i0 = 0; i0 < ne[0]; i0++) {
                    ((float *)result->data)[i1*ne[0] + i0] = frand()*(fmax - fmin) + fmin;
                }
            }
            break;
        case 3:
            for (int i2 = 0; i2 < ne[2]; i2++) {
                for (int i1 = 0; i1 < ne[1]; i1++) {
                    for (int i0 = 0; i0 < ne[0]; i0++) {
                        ((float *)result->data)[i2*ne[1]*ne[0] + i1*ne[0] + i0] = frand()*(fmax - fmin) + fmin;
                    }
                }
            }
            break;
        case 4:
            for (int i3 = 0; i3 < ne[3]; i3++) {
                for (int i2 = 0; i2 < ne[2]; i2++) {
                    for (int i1 = 0; i1 < ne[1]; i1++) {
                        for (int i0 = 0; i0 < ne[0]; i0++) {
                            ((float *)result->data)[i3*ne[2]*ne[1]*ne[0] + i2*ne[1]*ne[0] + i1*ne[0] + i0] = frand()*(fmax - fmin) + fmin;
                        }
                    }
                }
            }
            break;
        default:
            assert(false);
    };

    return result;
}